

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_quaternary_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,uint32_t op3,char *op)

{
  bool bVar1;
  char (*ts_9) [2];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = should_forward(this,op0);
  if (bVar1) {
    bVar1 = should_forward(this,op1);
    if (bVar1) {
      bVar1 = should_forward(this,op2);
      if (bVar1) {
        bVar1 = should_forward(this,op3);
        goto LAB_001c8bc7;
      }
    }
  }
  bVar1 = false;
LAB_001c8bc7:
  to_unpacked_expression_abi_cxx11_(&local_b0,this,op0,true);
  to_unpacked_expression_abi_cxx11_(&local_d0,this,op1,true);
  to_unpacked_expression_abi_cxx11_(&local_50,this,op2,true);
  ts_9 = (char (*) [2])0x1c8c2a;
  to_unpacked_expression_abi_cxx11_(&local_70,this,op3,true);
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
            (&local_90,(spirv_cross *)&op,(char **)0x2f8011,(char (*) [2])&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f4768,
             (char (*) [3])&local_d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f4768,
             (char (*) [3])&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f4768,
             (char (*) [3])&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e3e76,ts_9);
  emit_op(this,result_type,result_id,&local_90,bVar1,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op2);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op3);
  return;
}

Assistant:

void CompilerGLSL::emit_quaternary_func_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                           uint32_t op2, uint32_t op3, const char *op)
{
	bool forward = should_forward(op0) && should_forward(op1) && should_forward(op2) && should_forward(op3);
	emit_op(result_type, result_id,
	        join(op, "(", to_unpacked_expression(op0), ", ", to_unpacked_expression(op1), ", ",
	             to_unpacked_expression(op2), ", ", to_unpacked_expression(op3), ")"),
	        forward);

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
	inherit_expression_dependencies(result_id, op3);
}